

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_boundary_insertion<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>
               (void)

{
  uint uVar1;
  pointer puVar2;
  Index IVar3;
  pointer pvVar4;
  Column_support *pCVar5;
  ulong uVar6;
  node_ptr plVar7;
  int iVar8;
  int iVar9;
  undefined4 local_758;
  Index local_754;
  undefined1 *local_750;
  Index *local_748;
  undefined **local_740;
  ulong local_738;
  shared_count sStack_730;
  undefined1 **local_728;
  undefined **local_720;
  undefined1 local_718;
  undefined8 *local_710;
  undefined ***local_708;
  undefined **local_700;
  char *local_6f8;
  undefined8 *local_6f0;
  char *local_6e8;
  undefined1 local_6e0 [8];
  undefined8 local_6d8;
  shared_count sStack_6d0;
  char *local_6c8;
  char *local_6c0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  value_type boundary1;
  value_type boundary2;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>
  m;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>>
            ();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&boundary2,
             orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  puVar2 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar2 != (pointer)0x0) {
    pvVar4 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar2,(long)(pvVar4->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    pvVar4 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&boundary1,
             orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  puVar2 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar2 != (pointer)0x0) {
    pvVar4 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar2,(long)(pvVar4->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    pvVar4 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>
              *)&m.matrix_,&orderedBoundaries,m.colSettings_);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1ba);
  pCVar5 = &m.matrix_.reducedMatrixR_.matrix_.
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].column_;
  plVar7 = (node_ptr)pCVar5;
  do {
    plVar7 = (((type *)&plVar7->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar7 == (node_ptr)pCVar5) break;
  } while (*(int *)&plVar7[1].next_ != 0);
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_708 = &local_700;
  local_700 = (undefined **)0x1aef09;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_740._0_1_ = plVar7 == (node_ptr)pCVar5;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x1bb);
  pCVar5 = &m.matrix_.reducedMatrixR_.matrix_.
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[3].column_;
  plVar7 = (node_ptr)pCVar5;
  do {
    plVar7 = (((type *)&plVar7->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar7 == (node_ptr)pCVar5) break;
  } while (*(int *)&plVar7[1].next_ != 0);
  local_740._0_1_ = plVar7 != (node_ptr)pCVar5;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef1f;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = &local_700;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1bc);
  plVar7 = ((m.matrix_.reducedMatrixR_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->column_).super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740._0_1_ =
       plVar7 == (node_ptr)
                 &(m.matrix_.reducedMatrixR_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->column_ || plVar7 == (node_ptr)0x0;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef36;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = &local_700;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x1bd);
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740._0_1_ =
       plVar7 == (node_ptr)
                 &m.matrix_.reducedMatrixR_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].column_ || plVar7 == (node_ptr)0x0;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef4a;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = &local_700;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x1be);
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740._0_1_ =
       plVar7 == (node_ptr)
                 &m.matrix_.reducedMatrixR_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2].column_ || plVar7 == (node_ptr)0x0;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef5e;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = &local_700;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x1bf);
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740._0_1_ =
       plVar7 != (node_ptr)
                 &m.matrix_.reducedMatrixR_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[3].column_ && plVar7 != (node_ptr)0x0;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef72;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = &local_700;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x1c0);
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[4].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740 = (undefined **)
              CONCAT71(local_740._1_7_,
                       plVar7 != (node_ptr)
                                 &m.matrix_.reducedMatrixR_.matrix_.
                                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[4].column_ &&
                       plVar7 != (node_ptr)0x0);
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef87;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = &local_700;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  boost::test_tools::tt_detail::report_assertion(&local_740,&local_720,&local_180,0x1c0,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x1c2);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_748 = &local_754;
  local_754 = m.matrix_.reducedMatrixR_.nextInsertIndex_;
  local_6e0[0] = m.matrix_.reducedMatrixR_.nextInsertIndex_ == 5;
  local_758 = 5;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_708 = (undefined ***)&local_748;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  iVar8 = (int)((ulong)((long)boundary1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)boundary1.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2) + -1;
  if (boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar8 = 0;
  }
  else {
    uVar1 = boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
    uVar6 = ((long)((m.matrix_.reducedMatrixR_.super_Matrix_row_access_option.rows_)->
                   super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)((m.matrix_.reducedMatrixR_.super_Matrix_row_access_option.rows_)->
                   super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    if (uVar6 < uVar1 || uVar6 - uVar1 == 0) {
      std::
      vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>_>_>
      ::resize(m.matrix_.reducedMatrixR_.super_Matrix_row_access_option.rows_,(ulong)(uVar1 + 1));
    }
  }
  local_720 = (undefined **)CONCAT44(local_720._4_4_,m.matrix_.reducedMatrixR_.nextInsertIndex_);
  local_740 = (undefined **)CONCAT44(local_740._4_4_,iVar8);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>>>
  ::
  emplace_back<unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,int&,std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>>>>>*&,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>::Column_z2_settings*&>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>>>
              *)&m.matrix_.reducedMatrixR_.matrix_,(uint *)&local_720,&boundary1,(int *)&local_740,
             (vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>_>_>
              **)&m.matrix_.reducedMatrixR_,&m.matrix_.reducedMatrixR_.colSettings_);
  IVar3 = m.matrix_.reducedMatrixR_.nextInsertIndex_;
  m.matrix_.reducedMatrixR_.nextInsertIndex_ = m.matrix_.reducedMatrixR_.nextInsertIndex_ + 1;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>
  ::_insert_boundary(&m.matrix_,IVar3);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x1c4);
  iVar8 = 0;
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = m.matrix_.reducedMatrixR_.nextInsertIndex_;
  local_6e0[0] = m.matrix_.reducedMatrixR_.nextInsertIndex_ == 6;
  local_758 = 6;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  iVar9 = (int)((ulong)((long)boundary2.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)boundary2.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2) + -1;
  if ((boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start) &&
     (uVar1 = boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1],
     uVar6 = ((long)((m.matrix_.reducedMatrixR_.super_Matrix_row_access_option.rows_)->
                    super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)((m.matrix_.reducedMatrixR_.super_Matrix_row_access_option.rows_)->
                    super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
     iVar8 = iVar9, uVar6 < uVar1 || uVar6 - uVar1 == 0)) {
    std::
    vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>_>_>
    ::resize(m.matrix_.reducedMatrixR_.super_Matrix_row_access_option.rows_,(ulong)(uVar1 + 1));
  }
  local_720 = (undefined **)CONCAT44(local_720._4_4_,m.matrix_.reducedMatrixR_.nextInsertIndex_);
  local_740 = (undefined **)CONCAT44(local_740._4_4_,iVar8);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>>>
  ::
  emplace_back<unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,int&,std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>>>>>*&,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>::Column_z2_settings*&>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>>>
              *)&m.matrix_.reducedMatrixR_.matrix_,(uint *)&local_720,&boundary2,(int *)&local_740,
             (vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>_>_>
              **)&m.matrix_.reducedMatrixR_,&m.matrix_.reducedMatrixR_.colSettings_);
  IVar3 = m.matrix_.reducedMatrixR_.nextInsertIndex_;
  m.matrix_.reducedMatrixR_.nextInsertIndex_ = m.matrix_.reducedMatrixR_.nextInsertIndex_ + 1;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>
  ::_insert_boundary(&m.matrix_,IVar3);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x1c6);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = m.matrix_.reducedMatrixR_.nextInsertIndex_;
  local_6e0[0] = m.matrix_.reducedMatrixR_.nextInsertIndex_ == 7;
  local_758 = 7;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion
            (local_6e0,&local_700,&local_6c8,0x1c6,1,2,2,"m.get_number_of_columns()",&local_720,"7",
             &local_740);
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x1c7);
  pCVar5 = &m.matrix_.reducedMatrixR_.matrix_.
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].column_;
  plVar7 = (node_ptr)pCVar5;
  do {
    plVar7 = (((type *)&plVar7->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar7 == (node_ptr)pCVar5) break;
  } while (*(int *)&plVar7[1].next_ != 0);
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef09;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_708 = &local_700;
  local_740._0_1_ = plVar7 == (node_ptr)pCVar5;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x1c8);
  pCVar5 = &m.matrix_.reducedMatrixR_.matrix_.
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[3].column_;
  plVar7 = (node_ptr)pCVar5;
  do {
    plVar7 = (((type *)&plVar7->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar7 == (node_ptr)pCVar5) break;
  } while (*(int *)&plVar7[1].next_ != 0);
  local_740._0_1_ = plVar7 != (node_ptr)pCVar5;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef1f;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_708 = &local_700;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x1c9);
  plVar7 = ((m.matrix_.reducedMatrixR_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->column_).super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740._0_1_ =
       plVar7 == (node_ptr)
                 &(m.matrix_.reducedMatrixR_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->column_ || plVar7 == (node_ptr)0x0;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef36;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_708 = &local_700;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x1ca);
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740._0_1_ =
       plVar7 == (node_ptr)
                 &m.matrix_.reducedMatrixR_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].column_ || plVar7 == (node_ptr)0x0;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef4a;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_708 = &local_700;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x1cb);
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740._0_1_ =
       plVar7 == (node_ptr)
                 &m.matrix_.reducedMatrixR_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2].column_ || plVar7 == (node_ptr)0x0;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef5e;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_708 = &local_700;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x1cc);
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740._0_1_ =
       plVar7 != (node_ptr)
                 &m.matrix_.reducedMatrixR_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[3].column_ && plVar7 != (node_ptr)0x0;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef72;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_708 = &local_700;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x1cd);
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[4].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740._0_1_ =
       plVar7 != (node_ptr)
                 &m.matrix_.reducedMatrixR_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[4].column_ && plVar7 != (node_ptr)0x0;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aef87;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_708 = &local_700;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x1cf);
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740._0_1_ =
       plVar7 == (node_ptr)
                 &m.matrix_.reducedMatrixR_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[5].column_ || plVar7 == (node_ptr)0x0;
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aefa0;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_358 = "";
  local_708 = &local_700;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x1d3);
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[6].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_740 = (undefined **)
              CONCAT71(local_740._1_7_,
                       plVar7 != (node_ptr)
                                 &m.matrix_.reducedMatrixR_.matrix_.
                                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[6].column_ &&
                       plVar7 != (node_ptr)0x0);
  local_738 = 0;
  sStack_730.pi_ = (sp_counted_base *)0x0;
  local_700 = (undefined **)0x1aefb4;
  local_6f8 = "";
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d92e8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_388 = "";
  local_708 = &local_700;
  boost::test_tools::tt_detail::report_assertion(&local_740,&local_720,&local_390,0x1d3,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_730);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x1d5);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = ((m.matrix_.reducedMatrixR_.matrix_.
                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->super_Column_dimension_option).dim_;
  local_6e0[0] = local_754 == 0;
  local_758 = 0;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d90a8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c0,0x1d6);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = m.matrix_.reducedMatrixR_.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].super_Column_dimension_option.dim_;
  local_6e0[0] = local_754 == 0;
  local_758 = 0;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d90a8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x1d7);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = m.matrix_.reducedMatrixR_.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_6e0[0] = local_754 == 0;
  local_758 = 0;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d90a8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x1d8);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = m.matrix_.reducedMatrixR_.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].super_Column_dimension_option.dim_;
  local_6e0[0] = local_754 == 1;
  local_758 = 1;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d90a8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_420,0x1d9);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = m.matrix_.reducedMatrixR_.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[4].super_Column_dimension_option.dim_;
  local_6e0[0] = local_754 == 1;
  local_758 = 1;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d90a8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_440,0x1da);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = m.matrix_.reducedMatrixR_.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_;
  local_6e0[0] = local_754 == 1;
  local_758 = 1;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d90a8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x1db);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = m.matrix_.reducedMatrixR_.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_6e0[0] = local_754 == 2;
  local_758 = 2;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d90a8;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_480,0x1dd);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  plVar7 = ((m.matrix_.reducedMatrixR_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->column_).super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_754 = 0xffffffff;
  if (plVar7 != (node_ptr)
                &(m.matrix_.reducedMatrixR_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->column_ && plVar7 != (node_ptr)0x0) {
    local_754 = *(Index *)&((m.matrix_.reducedMatrixR_.matrix_.
                             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->column_).super_type.data_.
                           root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_758 = 0xffffffff;
  local_6e0[0] = local_754 == 0xffffffff;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d9030;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion
            (local_6e0,&local_700,&local_6c8,0x1dd,1,2,2,"m.get_pivot(0)",&local_720,
             "Matrix::template get_null_value<typename Matrix::ID_index>()",&local_740);
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4a0,0x1de);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_754 = 0xffffffff;
  if (plVar7 != (node_ptr)
                &m.matrix_.reducedMatrixR_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].column_ && plVar7 != (node_ptr)0x0) {
    local_754 = *(Index *)&m.matrix_.reducedMatrixR_.matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].column_.super_type.data_.
                           root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_758 = 0xffffffff;
  local_6e0[0] = local_754 == 0xffffffff;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d9030;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion
            (local_6e0,&local_700,&local_6c8,0x1de,1,2,2,"m.get_pivot(1)",&local_720,
             "Matrix::template get_null_value<typename Matrix::ID_index>()",&local_740);
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4c0,0x1df);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_754 = 0xffffffff;
  if (plVar7 != (node_ptr)
                &m.matrix_.reducedMatrixR_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].column_ && plVar7 != (node_ptr)0x0) {
    local_754 = *(Index *)&m.matrix_.reducedMatrixR_.matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[2].column_.super_type.data_.
                           root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_758 = 0xffffffff;
  local_6e0[0] = local_754 == 0xffffffff;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d9030;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion
            (local_6e0,&local_700,&local_6c8,0x1df,1,2,2,"m.get_pivot(2)",&local_720,
             "Matrix::template get_null_value<typename Matrix::ID_index>()",&local_740);
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4e0,0x1e0);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_754 = 0xffffffff;
  if (plVar7 != (node_ptr)
                &m.matrix_.reducedMatrixR_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].column_ && plVar7 != (node_ptr)0x0) {
    local_754 = *(Index *)&m.matrix_.reducedMatrixR_.matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[3].column_.super_type.data_.
                           root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_758 = 1;
  local_6e0[0] = local_754 == 1;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion
            (local_6e0,&local_700,&local_6c8,0x1e0,1,2,2,"m.get_pivot(3)",&local_720,"1",&local_740)
  ;
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_500,0x1e1);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[4].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_754 = 0xffffffff;
  if (plVar7 != (node_ptr)
                &m.matrix_.reducedMatrixR_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[4].column_ && plVar7 != (node_ptr)0x0) {
    local_754 = *(Index *)&m.matrix_.reducedMatrixR_.matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[4].column_.super_type.data_.
                           root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_758 = 2;
  local_6e0[0] = local_754 == 2;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion
            (local_6e0,&local_700,&local_6c8,0x1e1,1,2,2,"m.get_pivot(4)",&local_720,"2",&local_740)
  ;
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_520,0x1e3);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_754 = 0xffffffff;
  if (plVar7 != (node_ptr)
                &m.matrix_.reducedMatrixR_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[5].column_ && plVar7 != (node_ptr)0x0) {
    local_754 = *(Index *)&m.matrix_.reducedMatrixR_.matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[5].column_.super_type.data_.
                           root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_758 = 0xffffffff;
  local_6e0[0] = local_754 == 0xffffffff;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d9030;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion
            (local_6e0,&local_700,&local_6c8,0x1e3,1,2,2,"m.get_pivot(5)",&local_720,
             "Matrix::template get_null_value<typename Matrix::ID_index>()",&local_740);
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_540,0x1e7);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  plVar7 = m.matrix_.reducedMatrixR_.matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[6].column_.super_type.data_.root_plus_size_.
           m_header.super_node.next_;
  local_754 = 0xffffffff;
  if (plVar7 != (node_ptr)
                &m.matrix_.reducedMatrixR_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[6].column_ && plVar7 != (node_ptr)0x0) {
    local_754 = *(Index *)&m.matrix_.reducedMatrixR_.matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[6].column_.super_type.data_.
                           root_plus_size_.m_header.super_node.prev_[1].next_;
  }
  local_758 = 5;
  local_6e0[0] = local_754 == 5;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion
            (local_6e0,&local_700,&local_6c8,0x1e7,1,2,2,"m.get_pivot(6)",&local_720,"5",&local_740)
  ;
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_560,0x1ea);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = m.matrix_.pivotToColumnIndex_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[1];
  local_6e0[0] = local_754 == 3;
  local_758 = 3;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_580,0x1eb);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = m.matrix_.pivotToColumnIndex_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[2];
  local_6e0[0] = local_754 == 4;
  local_758 = 4;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_598 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5a0,0x1ec);
  local_6f8 = (char *)((ulong)local_6f8 & 0xffffffffffffff00);
  local_700 = &PTR__lazy_ostream_001d90e8;
  local_6f0 = &boost::unit_test::lazy_ostream::inst;
  local_6e8 = "";
  local_754 = m.matrix_.pivotToColumnIndex_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[5];
  local_6e0[0] = local_754 == 6;
  local_758 = 6;
  local_6d8 = 0;
  sStack_6d0.pi_ = (sp_counted_base *)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_6c0 = "";
  local_748 = &local_754;
  local_718 = 0;
  local_720 = &PTR__lazy_ostream_001d9030;
  local_710 = &boost::unit_test::lazy_ostream::inst;
  local_708 = (undefined ***)&local_748;
  local_738 = local_738 & 0xffffffffffffff00;
  local_740 = &PTR__lazy_ostream_001d90a8;
  sStack_730.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_728 = &local_750;
  local_750 = (undefined1 *)&local_758;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_6d0);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>
  ::~Matrix(&m);
  if (boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&orderedBoundaries);
  return;
}

Assistant:

void test_boundary_insertion() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  Matrix m(orderedBoundaries, 5);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));

  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 5);
  m.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  m.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK(m.is_zero_column(5));  // was reduced
  } else {
    BOOST_CHECK(!m.is_zero_column(5));  // not reduced
  }
  BOOST_CHECK(!m.is_zero_column(6));

  BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

  BOOST_CHECK_EQUAL(m.get_pivot(0), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(1), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(2), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(3), 1);
  BOOST_CHECK_EQUAL(m.get_pivot(4), 2);
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_pivot(5), Matrix::template get_null_value<typename Matrix::ID_index>());  // was reduced
  } else {
    BOOST_CHECK_EQUAL(m.get_pivot(5), 2);  // not reduced
  }
  BOOST_CHECK_EQUAL(m.get_pivot(6), 5);

  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 6);
  }
}